

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O3

char * __thiscall llvm::DataExtractor::getCStr(DataExtractor *this,uint64_t *offset_ptr)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  void *pvVar4;
  long lVar5;
  size_t __n;
  char *__s;
  
  uVar1 = *offset_ptr;
  uVar2 = (this->Data).Length;
  __n = uVar2 - uVar1;
  if (uVar1 <= uVar2 && __n != 0) {
    pcVar3 = (this->Data).Data;
    __s = pcVar3 + uVar1;
    pvVar4 = memchr(__s,0,__n);
    lVar5 = (long)pvVar4 - (long)pcVar3;
    if (lVar5 != -1 && pvVar4 != (void *)0x0) {
      *offset_ptr = lVar5 + 1;
      return __s;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *DataExtractor::getCStr(uint64_t *offset_ptr) const {
  uint64_t offset = *offset_ptr;
  StringRef::size_type pos = Data.find('\0', offset);
  if (pos != StringRef::npos) {
    *offset_ptr = pos + 1;
    return Data.data() + offset;
  }
  return nullptr;
}